

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  long in_FS_OFFSET;
  pointer local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->tmp_)._M_string_length = 0;
  *(this->tmp_)._M_dataplus._M_p = '\0';
  PutVarint32(&this->tmp_,(uint32_t)k->size_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->tmp_,k->data_,k->size_);
  local_30 = (this->tmp_)._M_dataplus._M_p;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek(&this->iter_,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }